

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

vector<BitState,_std::allocator<BitState>_> *
HdlcSimulationDataGenerator::BytesVectorToBitsVector
          (vector<BitState,_std::allocator<BitState>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *v,U32 numberOfBits)

{
  byte *pbVar1;
  uint uVar2;
  uint unaff_R12D;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  BitState bit;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = 0x80;
  bVar5 = true;
  uVar2 = 0;
  local_38 = v;
  for (uVar3 = 1; uVar3 - numberOfBits != 1; uVar3 = uVar3 + 1) {
    if (bVar5) {
      pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(local_38,(ulong)uVar2)
      ;
      unaff_R12D = (uint)*pbVar1;
      uVar2 = uVar2 + 1;
      uVar4 = 0x80;
    }
    bit = (BitState)((uVar4 & unaff_R12D & 0xff) != 0);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(__return_storage_ptr__,&bit);
    uVar4 = uVar4 >> 1;
    bVar5 = (uVar3 & 7) == 0;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<BitState> HdlcSimulationDataGenerator::BytesVectorToBitsVector( const vector<U8>& v, U32 numberOfBits )
{
    vector<BitState> bitsRet;
    U32 vectorIndex = 0;
    U8 byte;
    bool getByte = true;
    U8 bytePos = 0x80;
    for( U32 i = 0; i < numberOfBits; ++i )
    {
        if( getByte )
        {
            byte = v.at( vectorIndex );
            bytePos = 0x80;
            vectorIndex++;
        }

        BitState bit = ( byte & bytePos ) ? BIT_HIGH : BIT_LOW;
        bitsRet.push_back( bit );

        bytePos >>= 1;

        getByte = ( ( i + 1 ) % 8 == 0 );
    }

    return bitsRet;
}